

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirectDrawSurface.cpp
# Opt level: O2

bool __thiscall nv::DirectDrawSurface::isValid(DirectDrawSurface *this)

{
  bool bVar1;
  int iVar2;
  
  iVar2 = (*this->stream->_vptr_Stream[6])();
  if ((char)iVar2 == '\0') {
    bVar1 = false;
    if (((((this->header).fourcc == 0x20534444) && ((this->header).size == 0x7c)) &&
        (bVar1 = false, (~(this->header).flags & 6) == 0)) && ((this->header).pf.size == 0x20)) {
      bVar1 = (bool)((*(byte *)((long)&(this->header).caps.caps1 + 1) & 0x10) >> 4);
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool DirectDrawSurface::isValid() const
{
	if (stream->isError())
	{
		return false;
	}
	
	if (header.fourcc != FOURCC_DDS || header.size != 124)
	{
		return false;
	}
	
	const uint required = (DDSD_WIDTH|DDSD_HEIGHT/*|DDSD_CAPS|DDSD_PIXELFORMAT*/);
	if( (header.flags & required) != required ) {
		return false;
	}
	
	if (header.pf.size != 32) {
		return false;
	}
	
	if( !(header.caps.caps1 & DDSCAPS_TEXTURE) ) {
		return false;
	}
	
	return true;
}